

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

PositionMode __thiscall QCss::Declaration::positionValue(Declaration *this)

{
  DeclarationData *pDVar1;
  PositionMode PVar2;
  quint64 qVar3;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar1->parsed).d.field_0x18 < 4) {
    PVar2 = PositionMode_Unknown;
    if ((pDVar1->values).d.size == 1) {
      ::QVariant::toString();
      qVar3 = findKnownValue((QString *)&local_40,positions,5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
      PVar2 = (PositionMode)qVar3;
      ::QVariant::QVariant(&local_40,PVar2);
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,&local_40);
      ::QVariant::~QVariant(&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return PVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    PVar2 = ::QVariant::toInt((bool *)&pDVar1->parsed);
    return PVar2;
  }
  __stack_chk_fail();
}

Assistant:

PositionMode Declaration::positionValue() const
{
    if (d->parsed.isValid())
        return static_cast<PositionMode>(d->parsed.toInt());
    if (d->values.size() != 1)
        return PositionMode_Unknown;
    int v = findKnownValue(d->values.at(0).variant.toString(),
                           positions, NumKnownPositionModes);
    d->parsed = v;
    return static_cast<PositionMode>(v);
}